

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcc.c
# Opt level: O2

uint getclock_ms(void)

{
  undefined1 local_20 [8];
  timeval tv;
  
  gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  return (int)((tv.tv_sec + 500) / 1000) + local_20._0_4_ * 1000;
}

Assistant:

static unsigned getclock_ms(void) {
#ifdef _WIN32
  return GetTickCount();
#else
  struct timeval tv;
  gettimeofday(&tv, NULL);
  return tv.tv_sec * 1000 + (tv.tv_usec + 500) / 1000;
#endif
}